

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O3

void __thiscall
kratos::PipelineInsertionVisitor::visit(PipelineInsertionVisitor *this,Generator *generator)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pvVar1;
  undefined8 *puVar2;
  element_type *peVar3;
  pointer __nptr;
  SequentialStmtBlock *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  shared_ptr<kratos::Var> *var;
  StmtBlock *pSVar4;
  undefined8 uVar5;
  pointer pbVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  Var *pVVar11;
  _Base_ptr p_Var12;
  GeneratorException *this_02;
  undefined1 auVar13 [8];
  undefined8 uVar14;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  long lVar15;
  bool bVar16;
  long lVar17;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  initializer_list<kratos::IRNode_*> __l;
  undefined1 local_198 [8];
  vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
  attributes;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  port_names;
  undefined1 local_138 [8];
  shared_ptr<kratos::Port> clock_port;
  size_type *local_118;
  string clock_name;
  vector<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
  blocks;
  undefined1 local_d8 [8];
  shared_ptr<kratos::Port> port;
  _Alloc_hider _Stack_c0;
  undefined1 auStack_b8 [8];
  vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_> vars;
  undefined8 local_98;
  undefined1 local_88 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 auStack_58 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  clock_names;
  
  local_118 = &clock_name._M_string_length;
  clock_name._M_dataplus._M_p = (pointer)0x0;
  clock_name._M_string_length._0_1_ = 0;
  local_78.field_2._8_8_ = generator;
  std::
  vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>::
  vector((vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
          *)local_198,&(generator->super_IRNode).attributes_);
  if (local_198 !=
      (undefined1  [8])
      attributes.
      super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar16 = false;
    local_98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    auVar13 = local_198;
    do {
      iVar7 = std::__cxx11::string::compare
                        ((char *)&((((pointer)auVar13)->
                                   super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr)->type_str);
      peVar3 = (((pointer)auVar13)->
               super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (iVar7 == 0) {
        __nptr = (pointer)(peVar3->value_str)._M_dataplus._M_p;
        piVar9 = __errno_location();
        iVar7 = *piVar9;
        *piVar9 = 0;
        p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  strtol((char *)__nptr,
                         (char **)&attributes.
                                   super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,10);
        if (attributes.
            super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage == __nptr) {
          std::__throw_invalid_argument("stoi");
LAB_00215eb7:
          std::__throw_out_of_range("stoi");
        }
        iVar8 = (int)p_Var10;
        if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(long)iVar8 != p_Var10) ||
           (*piVar9 == 0x22)) goto LAB_00215eb7;
        if (*piVar9 == 0) {
          *piVar9 = iVar7;
        }
        if (0 < iVar8) {
          local_98 = p_Var10;
        }
        local_98 = local_98 & 0xffffffff;
        bVar16 = (bool)(bVar16 | 0 < iVar8);
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)&peVar3->type_str);
        if (iVar7 == 0) {
          std::__cxx11::string::_M_assign((string *)&local_118);
        }
      }
      uVar14 = local_78.field_2._8_8_;
      auVar13 = (undefined1  [8])((long)auVar13 + 0x10);
    } while (auVar13 !=
             (undefined1  [8])
             attributes.
             super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
    if (bVar16) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&attributes.
                     super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_78.field_2._8_8_ + 0x130));
      if (clock_name._M_dataplus._M_p == (pointer)0x0) {
        Generator::get_ports_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)auStack_58,(Generator *)uVar14,Clock);
        if (auStack_58 !=
            (undefined1  [8])
            clock_names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          std::__cxx11::string::_M_assign((string *)&local_118);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_58);
        if (clock_name._M_dataplus._M_p == (pointer)0x0) {
          this_02 = (GeneratorException *)__cxa_allocate_exception(0x10);
          local_88._0_8_ = (((string *)(uVar14 + 0x78))->_M_dataplus)._M_p;
          local_88._8_8_ = *(size_type *)(uVar14 + 0x80);
          format_str_00.size_ = 0xd;
          format_str_00.data_ = (char *)0x2d;
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = in_R9.args_;
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)local_88;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)auStack_58,(detail *)"Unable to find clock signal for generator {0}",
                     format_str_00,args_00);
          clock_name.field_2._8_8_ = local_78.field_2._8_8_;
          __l._M_len = 1;
          __l._M_array = (iterator)((long)&clock_name.field_2 + 8);
          std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                    ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)local_88,__l,
                     (allocator_type *)auStack_b8);
          GeneratorException::GeneratorException
                    (this_02,(string *)auStack_58,
                     (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)local_88);
          __cxa_throw(this_02,&GeneratorException::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      Generator::get_port((Generator *)local_138,(string *)uVar14);
      clock_name.field_2._8_8_ = 0;
      iVar7 = (int)local_98;
      std::
      vector<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
      ::resize((vector<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
                *)((long)&clock_name.field_2 + 8),local_98);
      if (iVar7 != 0) {
        lVar17 = 0;
        do {
          std::__shared_ptr<kratos::SequentialStmtBlock,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<std::allocator<kratos::SequentialStmtBlock>>
                    ((__shared_ptr<kratos::SequentialStmtBlock,(__gnu_cxx::_Lock_policy)2> *)
                     auStack_58,(allocator<kratos::SequentialStmtBlock> *)local_88);
          pbVar6 = clock_names.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          auVar13 = auStack_58;
          auStack_58 = (undefined1  [8])0x0;
          clock_names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          p_Var10 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                     (clock_name.field_2._8_8_ + 8 + lVar17);
          *(undefined8 *)(clock_name.field_2._8_8_ + lVar17) = auVar13;
          ((undefined8 *)(clock_name.field_2._8_8_ + lVar17))[1] = pbVar6;
          if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
          }
          if (clock_names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       clock_names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
          }
          clock_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  (clock_name.field_2._8_8_ + lVar17);
          p_Var10 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                     (clock_name.field_2._8_8_ + 8 + lVar17);
          if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
            }
          }
          Generator::add_stmt((Generator *)uVar14,
                              (shared_ptr<kratos::Stmt> *)
                              &clock_port.
                               super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
          if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
          }
          this_00 = *(SequentialStmtBlock **)(clock_name.field_2._8_8_ + lVar17);
          auStack_58 = (undefined1  [8])((ulong)auStack_58 & 0xffffffff00000000);
          clock_names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_138;
          clock_names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)clock_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr;
          if (clock_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              pvVar1 = &((clock_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_Var).super_IRNode.fn_name_ln;
              *(int *)&(pvVar1->
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       )._M_impl.super__Vector_impl_data._M_start =
                   *(int *)&(pvVar1->
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1;
              UNLOCK();
            }
            else {
              pvVar1 = &((clock_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_Var).super_IRNode.fn_name_ln;
              *(int *)&(pvVar1->
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       )._M_impl.super__Vector_impl_data._M_start =
                   *(int *)&(pvVar1->
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1;
            }
          }
          SequentialStmtBlock::add_condition
                    (this_00,(pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> *)
                             auStack_58);
          if (clock_names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       clock_names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
          }
          if (*(bool *)(uVar14 + 0xbc) == true) {
            auStack_58 = (undefined1  [8])0x251b5d;
            clock_names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(clock_names.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,0x242);
            std::
            vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
            ::emplace_back<std::pair<char_const*,int>>
                      ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                        *)(*(long *)(clock_name.field_2._8_8_ + lVar17) + 8),
                       (pair<const_char_*,_int> *)auStack_58);
          }
          lVar17 = lVar17 + 0x10;
        } while (local_98 << 4 != lVar17);
      }
      if (port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
          (_Base_ptr)&port_names) {
        lVar17 = (ulong)(iVar7 - 1) * 0x10;
        p_Var12 = port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        do {
          Generator::get_port((Generator *)local_d8,(string *)uVar14);
          if (*(int *)&(((Var *)((long)local_d8 + 0x270))->super_IRNode)._vptr_IRNode != 0) {
            auStack_b8 = (undefined1  [8])0x0;
            vars.
            super__Vector_base<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            vars.
            super__Vector_base<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            port_names._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)p_Var12;
            std::
            vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>::
            resize((vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>
                    *)auStack_b8,local_98);
            if (iVar7 != 0) {
              lVar15 = 8;
              p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              do {
                format_str.size_ = 2;
                format_str.data_ = (char *)0x9;
                args.
                super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                .field_1.args_ = in_R9.args_;
                args.
                super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                .desc_ = (unsigned_long_long)
                         &port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount;
                port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                     = p_Var10;
                fmt::v7::detail::vformat_abi_cxx11_
                          ((string *)local_88,(detail *)"stage_{0}",format_str,args);
                Generator::get_unique_variable_name
                          ((string *)auStack_58,(Generator *)local_78.field_2._8_8_,
                           (string *)(p_Var12 + 1),(string *)local_88);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_88._0_8_ != &local_78) {
                  operator_delete((void *)local_88._0_8_,(ulong)(local_78._M_dataplus._M_p + 1));
                }
                uVar14 = local_78.field_2._8_8_;
                pVVar11 = Generator::var((Generator *)local_78.field_2._8_8_,(string *)auStack_58,
                                         *(uint32_t *)((long)local_d8 + 0x98),
                                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                         ((long)local_d8 + 0xa0),*(bool *)((long)local_d8 + 0xf0));
                if (*(bool *)(uVar14 + 0xbc) == true) {
                  local_88._0_8_ =
                       "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/optimize.cc"
                  ;
                  local_88._8_4_ = 0x252;
                  std::
                  vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                  ::emplace_back<std::pair<char_const*,int>>
                            ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                              *)&(pVVar11->super_IRNode).fn_name_ln,
                             (pair<const_char_*,_int> *)local_88);
                }
                std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<kratos::Var,void>
                          ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)local_88,
                           (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                           &pVVar11->super_enable_shared_from_this<kratos::Var>);
                uVar5 = local_88._8_8_;
                uVar14 = local_88._0_8_;
                local_88._0_8_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                local_88._8_8_ = (pointer)0x0;
                this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                           ((long)&((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                                   auStack_b8)->_M_ptr + lVar15);
                puVar2 = (undefined8 *)((long)auStack_b8 + lVar15 + -8);
                *puVar2 = uVar14;
                puVar2[1] = uVar5;
                if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
                }
                if ((pointer)local_88._8_8_ != (pointer)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
                }
                if (auStack_58 !=
                    (undefined1  [8])
                    &clock_names.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) {
                  operator_delete((void *)auStack_58,
                                  (ulong)((long)&((clock_names.
                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish)->
                                                 _M_dataplus)._M_p + 1));
                }
                p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          ((long)&p_Var10->_vptr__Sp_counted_base + 1);
                lVar15 = lVar15 + 0x10;
              } while ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98 != p_Var10);
            }
            Var::move_src_to((Var *)local_d8,
                             ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)auStack_b8)->
                             _M_ptr,(Generator *)local_78.field_2._8_8_,false);
            p_Var12 = (_Base_ptr)port_names._M_t._M_impl.super__Rb_tree_header._M_node_count;
            if ((ulong)(iVar7 - 1) != 0) {
              lVar15 = 0;
              do {
                auStack_58 = *(undefined1 (*) [8])
                              ((long)&((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                                      auStack_b8)->_M_ptr + lVar15);
                clock_names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     *(pointer *)
                      ((long)&(((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)auStack_b8)
                              ->_M_refcount)._M_pi + lVar15);
                if (clock_names.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    *(int *)&(clock_names.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_string_length =
                         (int)(clock_names.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length + 1;
                    UNLOCK();
                  }
                  else {
                    *(int *)&(clock_names.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_string_length =
                         (int)(clock_names.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length + 1;
                  }
                }
                var = *(shared_ptr<kratos::Var> **)
                       ((long)&(((pointer)((long)auStack_b8 + 0x10))->
                               super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
                       lVar15);
                p_Var10 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                           ((long)&(((pointer)((long)auStack_b8 + 0x10))->
                                   super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>).
                                   _M_refcount._M_pi + lVar15);
                if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
                  }
                }
                pSVar4 = *(StmtBlock **)(clock_name.field_2._8_8_ + lVar15);
                Var::assign((Var *)&port.
                                    super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount,var,(AssignmentType)auStack_58);
                local_88._0_8_ =
                     port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
                local_88._8_8_ = _Stack_c0._M_p;
                port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                     = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                _Stack_c0._M_p = (pointer)0x0;
                StmtBlock::add_stmt(pSVar4,(shared_ptr<kratos::Stmt> *)local_88);
                if ((pointer)local_88._8_8_ != (pointer)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
                }
                if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
                }
                if (clock_names.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             clock_names.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
                }
                lVar15 = lVar15 + 0x10;
              } while (lVar17 != lVar15);
            }
            pSVar4 = *(StmtBlock **)(clock_name.field_2._8_8_ + lVar17);
            Var::assign((Var *)local_88,(shared_ptr<kratos::Var> *)local_d8,
                        auStack_b8._0_4_ + (int)lVar17);
            auStack_58 = (undefined1  [8])local_88._0_8_;
            clock_names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)local_88._8_8_;
            local_88._0_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_88._8_8_ = (pointer)0x0;
            StmtBlock::add_stmt(pSVar4,(shared_ptr<kratos::Stmt> *)auStack_58);
            if (clock_names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         clock_names.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
            }
            uVar14 = local_78.field_2._8_8_;
            if ((pointer)local_88._8_8_ != (pointer)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
            }
            std::
            vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>::
            ~vector((vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>
                     *)auStack_b8);
          }
          if (port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          }
          p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
        } while (p_Var12 != (_Rb_tree_node_base *)&port_names);
      }
      std::
      vector<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
      ::~vector((vector<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
                 *)((long)&clock_name.field_2 + 8));
      if (clock_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   clock_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&attributes.
                      super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  std::
  vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
           *)local_198);
  if (local_118 != &clock_name._M_string_length) {
    operator_delete(local_118,
                    CONCAT71(clock_name._M_string_length._1_7_,
                             (undefined1)clock_name._M_string_length) + 1);
  }
  return;
}

Assistant:

void visit(Generator* generator) override {
        // only if the generator has attribute of "pipeline" and the value string is the
        // number of pipeline stages will do
        bool has_attribute = false;
        std::string clock_name;
        auto attributes = generator->get_attributes();
        uint32_t num_stages = 0;
        for (auto const& attr : attributes) {
            if (attr->type_str == "pipeline") {
                try {
                    int i = std::stoi(attr->value_str);
                    if (i > 0) {
                        num_stages = static_cast<uint32_t>(i);
                        has_attribute = true;
                    }
                } catch (std::invalid_argument const&) {
                    throw std::runtime_error(
                        ::format("Unable to get value string from generator {0}", generator->name));
                }
            } else if (attr->type_str == "pipeline_clk") {
                clock_name = attr->value_str;
            }
        }
        if (has_attribute) {
            auto port_names = generator->get_port_names();
            // get the clock name, if it's empty
            if (clock_name.empty()) {
                // pick the first one
                auto clock_names = generator->get_ports(PortType::Clock);
                if (!clock_names.empty()) clock_name = clock_names[0];
            }
            if (clock_name.empty()) {
                throw GeneratorException(
                    ::format("Unable to find clock signal for generator {0}", generator->name),
                    {generator});
            }
            auto clock_port = generator->get_port(clock_name);
            // we need to create all the registers based on the posedge of the clock
            std::vector<std::shared_ptr<SequentialStmtBlock>> blocks;
            blocks.resize(num_stages);
            for (uint32_t i = 0; i < num_stages; i++) {
                blocks[i] = std::make_shared<SequentialStmtBlock>();
                generator->add_stmt(blocks[i]);
                blocks[i]->add_condition({EventEdgeType::Posedge, clock_port});
                if (generator->debug)
                    blocks[i]->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
            }
            // get all the outputs
            for (auto const& port_name : port_names) {
                auto port = generator->get_port(port_name);
                if (port->port_direction() == PortDirection::In) {
                    continue;
                }
                std::vector<std::shared_ptr<Var>> vars;
                vars.resize(num_stages);
                for (uint32_t i = 0; i < num_stages; i++) {
                    auto new_name =
                        generator->get_unique_variable_name(port_name, ::format("stage_{0}", i));
                    auto& var = generator->var(new_name, port->var_width(), port->size(),
                                               port->is_signed());
                    if (generator->debug)
                        var.fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
                    vars[i] = var.shared_from_this();
                }
                // move the source to the first stage
                Var::move_src_to(port.get(), vars[0].get(), generator, false);
                // connect the stages together
                for (uint32_t i = 0; i < num_stages - 1; i++) {
                    auto pre_stage = vars[i];
                    auto next_stage = vars[i + 1];
                    blocks[i]->add_stmt(next_stage->assign(pre_stage, AssignmentType::NonBlocking));
                }
                // last stage
                blocks[num_stages - 1]->add_stmt(
                    port->assign(vars[num_stages - 1], AssignmentType::NonBlocking));
            }
        }
    }